

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubsub.hpp
# Opt level: O2

void __thiscall
ps::Publisher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>::
emit_signal(Publisher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
            *this,int type_signal)

{
  mapped_type mVar1;
  mapped_type *pmVar2;
  uint local_24;
  
  local_24 = type_signal;
  std::mutex::lock(&this->m);
  pmVar2 = std::
           map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
           ::operator[](&this->m_signals,(key_type_conflict *)&local_24);
  mVar1 = *pmVar2;
  *pmVar2 = mVar1 + 1;
  if ((long)(this->m_topics).
            super__Vector_base<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->m_topics).
            super__Vector_base<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 4 == (ulong)(mVar1 + 1)) {
    pmVar2 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](&this->m_signals,(key_type_conflict *)&local_24);
    *pmVar2 = 0;
    (**this->_vptr_Publisher)(this,(ulong)local_24);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m);
  return;
}

Assistant:

void emit_signal(int type_signal)
		{
			std::lock_guard<std::mutex> l{m};
			if (++m_signals[type_signal] == m_topics.size())
			{
				m_signals[type_signal] = 0;
				signal(type_signal);
			}
		}